

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

string * __thiscall
tinyformat::format<unsigned_short,std::__cxx11::string>
          (string *__return_storage_ptr__,tinyformat *this,char *fmt,unsigned_short *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  ostringstream local_1a0 [8];
  ostringstream oss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_1;
  unsigned_short *args_local;
  char *fmt_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  format<unsigned_short,std::__cxx11::string>
            ((ostream *)local_1a0,(char *)this,(unsigned_short *)fmt,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string format(const char* fmt, const Args&... args)
{
    std::ostringstream oss;
    format(oss, fmt, args...);
    return oss.str();
}